

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O0

add_torrent_params * __thiscall
libtorrent::parse_magnet_uri
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,string_view uri)

{
  string_view uri_00;
  bool bVar1;
  undefined1 local_30 [8];
  error_code ec;
  string_view uri_local;
  add_torrent_params *ret;
  
  ec.cat_ = (error_category *)this;
  boost::system::error_code::error_code((error_code *)local_30);
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  uri_00._M_str = (char *)uri._M_len;
  uri_00._M_len = (size_t)ec.cat_;
  parse_magnet_uri(uri_00,__return_storage_ptr__,(error_code *)local_30);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_30);
  if (bVar1) {
    aux::throw_ex<boost::system::system_error,boost::system::error_code&>((error_code *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params parse_magnet_uri(string_view uri)
	{
		error_code ec;
		add_torrent_params ret;
		parse_magnet_uri(uri, ret, ec);
		if (ec) aux::throw_ex<system_error>(ec);
		return ret;
	}